

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O1

double __thiscall ODDLParser::Value::getDouble(Value *this)

{
  double v;
  double local_10;
  
  if (this->m_type == ddl_double) {
    memcpy(&local_10,this->m_data,this->m_size);
    return (double)(float)local_10;
  }
  return (double)(ulong)*(uint *)this->m_data;
}

Assistant:

double Value::getDouble() const {
    if ( m_type == ddl_double ) {
        double v;
        ::memcpy( &v, m_data, m_size );
        return ( float ) v;
    }
    else {
        double tmp;
        ::memcpy( &tmp, m_data, 4 );
        return ( double ) tmp;
    }
}